

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall
Analyser_containsExternalVariableByName_Test::TestBody
          (Analyser_containsExternalVariableByName_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  AnalyserPtr analyser;
  ModelPtr model;
  ParserPtr parser;
  long *local_c0 [2];
  long local_b0 [2];
  AssertionResult local_a0;
  long local_90 [2];
  shared_ptr local_80 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  string local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  undefined1 local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  libcellml::Parser::create(SUB81(local_30,0));
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_a0);
  libcellml::Parser::parseModel(local_50);
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  local_c0[0] = (long *)0x0;
  local_60 = (shared_ptr *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a0,"size_t(0)","parser->issueCount()",(unsigned_long *)local_c0,
             (unsigned_long *)&local_60);
  if ((string)local_a0.success_ == (string)0x0) {
    testing::Message::Message((Message *)local_c0);
    if (local_a0.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_a0.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x218,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_c0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0[0] != (long *)0x0)) {
        (**(code **)(*local_c0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Analyser::create();
  psVar1 = local_60;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"membrane","");
  libcellml::ComponentEntity::component(local_40,(bool)local_50[0]);
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"V","");
  libcellml::Component::variable(local_70);
  libcellml::AnalyserExternalVariable::create(local_80);
  libcellml::Analyser::addExternalVariable(psVar1);
  if (local_78.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.ptr_);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  psVar1 = local_60;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"membrane","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"V","");
  local_80[0] = (shared_ptr)
                libcellml::Analyser::containsExternalVariable(psVar1,local_50,(string *)&local_a0);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_80[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(char *)local_80,
               "analyser->containsExternalVariable(model, \"membrane\", \"V\")","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x21e,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if ((long *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    }
    if (local_c0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0[0] != (long *)0x0)) {
        (**(code **)(*local_c0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_60;
  local_a0._0_8_ = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"membrane","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"X","");
  bVar3 = libcellml::Analyser::containsExternalVariable(psVar1,local_50,(string *)&local_a0);
  local_80[0] = (shared_ptr)(bVar3 ^ 1);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_c0[0] != local_b0) {
    operator_delete(local_c0[0],local_b0[0] + 1);
  }
  if ((long *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
  }
  if (local_80[0] == (shared_ptr)0x0) {
    testing::Message::Message((Message *)local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(char *)local_80,
               "analyser->containsExternalVariable(model, \"membrane\", \"X\")","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyser.cpp"
               ,0x21f,(char *)local_a0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if ((long *)local_a0._0_8_ != local_90) {
      operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
    }
    if (local_c0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0[0] != (long *)0x0)) {
        (**(code **)(*local_c0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

TEST(Analyser, containsExternalVariableByName)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));

    EXPECT_TRUE(analyser->containsExternalVariable(model, "membrane", "V"));
    EXPECT_FALSE(analyser->containsExternalVariable(model, "membrane", "X"));
}